

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

void __thiscall
pbrt::Image::SetChannels(Image *this,Point2i p,ImageChannelDesc *desc,span<const_float> values)

{
  anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
  *paVar1;
  ulong uVar2;
  ulong uVar3;
  int vb;
  anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
  *local_40;
  size_t va;
  
  uVar2 = values.n;
  vb = (int)(this->channelNames).nStored;
  va = uVar2;
  if (uVar2 <= (ulong)(long)vb) {
    if (uVar2 != 0) {
      local_40 = &(desc->offset).field_2;
      uVar3 = 0;
      do {
        paVar1 = (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
                  *)(desc->offset).ptr;
        if (paVar1 == (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
                       *)0x0) {
          paVar1 = local_40;
        }
        SetChannel(this,p,paVar1->fixed[uVar3],values.ptr[uVar3]);
        uVar3 = uVar3 + 1;
      } while (uVar2 != uVar3);
    }
    return;
  }
  LogFatal<char_const(&)[14],char_const(&)[12],char_const(&)[14],unsigned_long&,char_const(&)[12],int&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
             ,0x1a4,"Check failed: %s <= %s with %s = %s, %s = %s",(char (*) [14])"values.size()",
             (char (*) [12])0x5545e1,(char (*) [14])"values.size()",&va,(char (*) [12])0x5545e1,&vb)
  ;
}

Assistant:

void Image::SetChannels(Point2i p, const ImageChannelDesc &desc,
                        pstd::span<const Float> values) {
    CHECK_LE(values.size(), NChannels());
    for (size_t i = 0; i < values.size(); ++i)
        SetChannel(p, desc.offset[i], values[i]);
}